

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_data.c
# Opt level: O3

intptr_t fiobj_data_i(FIOBJ o)

{
  int iVar1;
  int *piVar2;
  intptr_t iVar3;
  stat stat;
  stat local_a0;
  
  if (*(uint *)(o + 0x30) < 0xfffffffe) {
    do {
      iVar1 = fstat(*(int *)(o + 0x30),&local_a0);
      if (iVar1 == 0) {
        return local_a0.st_size;
      }
      piVar2 = __errno_location();
    } while (*piVar2 == 4);
    iVar3 = -1;
  }
  else {
    iVar3 = *(intptr_t *)(o + 0x20);
  }
  return iVar3;
}

Assistant:

static intptr_t fiobj_data_i(const FIOBJ o) {
  switch (obj2io(o)->fd) {
  case -1:
  case -2:
    return obj2io(o)->len;
    break;
  default:
    return fiobj_data_get_fd_size(o);
  }
}